

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall
adios2::query::QueryComposite::BlockIndexEvaluate
          (QueryComposite *this,IO *io,Engine *reader,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *touchedBlocks)

{
  bool bVar1;
  size_type sVar2;
  reference ppQVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *unaff_retaddr;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *in_stack_00000008;
  anon_class_1_0_00000001 *in_stack_00000010;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *in_stack_00000018;
  anon_class_1_0_00000001 *in_stack_00000020;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> currBlocks;
  QueryBase *node;
  iterator __end2;
  iterator __begin2;
  vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_> *__range2;
  int counter;
  anon_class_1_0_00000001 lf_ApplyOR;
  anon_class_1_0_00000001 lf_ApplyAND;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff94;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> local_60;
  QueryBase *local_48;
  QueryBase **local_40;
  __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
  local_38;
  long local_30;
  int local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>::size
                    ((vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
                      *)(in_RDI + 0x40));
  if (sVar2 != 0) {
    local_28 = 0;
    local_30 = in_RDI + 0x40;
    local_38._M_current =
         (QueryBase **)
         std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>::begin
                   ((vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
                     *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_40 = (QueryBase **)
               std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
               ::end((vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
                      *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
          bVar1) {
      ppQVar3 = __gnu_cxx::
                __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
                ::operator*(&local_38);
      local_48 = *ppQVar3;
      local_28 = local_28 + 1;
      in_stack_ffffffffffffff80 = &local_60;
      std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::vector
                ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                 0xd28506);
      (*local_48->_vptr_QueryBase[4])(local_48,local_10,local_18,in_stack_ffffffffffffff80);
      if (local_28 == 1) {
        std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::operator=
                  ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                   in_stack_00000020,in_stack_00000018);
        in_stack_ffffffffffffff7c = 3;
      }
      else {
        sVar2 = std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::size
                          (&local_60);
        if (sVar2 == 0) {
          if (*(int *)(in_RDI + 0x38) == 0) {
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::clear
                      ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                       0xd2858d);
            in_stack_ffffffffffffff7c = 2;
          }
          else {
            in_stack_ffffffffffffff7c = 3;
          }
        }
        else {
          if (*(int *)(in_RDI + 0x38) == 0) {
            BlockIndexEvaluate::anon_class_1_0_00000001::operator()
                      (in_stack_00000020,in_stack_00000018,
                       (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                       in_stack_00000010);
          }
          else if (*(int *)(in_RDI + 0x38) == 1) {
            BlockIndexEvaluate::anon_class_1_0_00000001::operator()
                      (in_stack_00000010,in_stack_00000008,unaff_retaddr);
          }
          in_stack_ffffffffffffff7c = 0;
        }
      }
      std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
                ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff7c));
      if ((in_stack_ffffffffffffff7c != 0) && (in_stack_ffffffffffffff7c == 2)) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void QueryComposite::BlockIndexEvaluate(adios2::core::IO &io, adios2::core::Engine &reader,
                                        // std::vector<Box<Dims>> &touchedBlocks)
                                        std::vector<BlockHit> &touchedBlocks)
{
    auto lf_ApplyAND = [&](std::vector<BlockHit> &touched,
                           const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
        {
            touched.clear();
            return;
        }

        for (auto i = touched.size(); i >= 1; i--)
        {
            bool intersects = false;
            for (auto b : curr)
            {
                if (touched[i].applyIntersection(b))
                {
                    intersects = true;
                    break;
                }
            }
            if (!intersects)
                touched.erase(touched.begin() + i - 1);
        }
    }; // lf_ApplyAND

    auto lf_ApplyOR = [&](std::vector<BlockHit> &touched,
                          const std::vector<BlockHit> &curr) -> void {
        if (curr.size() == 0)
            return;

        for (auto b : curr)
        {
            bool duplicated = false;
            for (auto box : touched)
            {
                if (box.applyExtension(b))
                {
                    duplicated = true;
                    continue;
                }
            }
            if (!duplicated)
                touched.push_back(b);
        }
    }; // lf_ApplyOR

    if (m_Nodes.size() == 0)
        return;

    int counter = 0;
    for (auto node : m_Nodes)
    {
        counter++;
        std::vector<BlockHit> currBlocks;
        node->BlockIndexEvaluate(io, reader, currBlocks);
        if (counter == 1)
        {
            touchedBlocks = currBlocks;
            continue;
        }

        if (currBlocks.size() == 0)
        {
            if (adios2::query::Relation::AND == m_Relation)
            {
                touchedBlocks.clear();
                break;
            }
            else
                continue;
        }

        if (adios2::query::Relation::AND == m_Relation)
            lf_ApplyAND(touchedBlocks, currBlocks);
        else if (adios2::query::Relation::OR == m_Relation)
            lf_ApplyOR(touchedBlocks, currBlocks);
    }
}